

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpWatchDog.c
# Opt level: O0

qpWatchDog *
qpWatchDog_create(qpWatchDogFunc timeOutFunc,void *userPtr,int totalTimeLimitSecs,
                 int intervalTimeLimitSecs)

{
  deThread dVar1;
  qpWatchDog *dog;
  int intervalTimeLimitSecs_local;
  int totalTimeLimitSecs_local;
  void *userPtr_local;
  qpWatchDogFunc timeOutFunc_local;
  
  timeOutFunc_local = (qpWatchDogFunc)deCalloc(0x38);
  if ((qpWatchDog *)timeOutFunc_local != (qpWatchDog *)0x0) {
    ((qpWatchDog *)timeOutFunc_local)->timeOutFunc = timeOutFunc;
    ((qpWatchDog *)timeOutFunc_local)->timeOutUserPtr = userPtr;
    ((qpWatchDog *)timeOutFunc_local)->totalTimeLimit = totalTimeLimitSecs;
    ((qpWatchDog *)timeOutFunc_local)->intervalTimeLimit = intervalTimeLimitSecs;
    qpWatchDog_reset((qpWatchDog *)timeOutFunc_local);
    ((qpWatchDog *)timeOutFunc_local)->status = STATUS_THREAD_RUNNING;
    dVar1 = deThread_create(watchDogThreadFunc,timeOutFunc_local,(deThreadAttributes *)0x0);
    ((qpWatchDog *)timeOutFunc_local)->watchDogThread = dVar1;
    if (((qpWatchDog *)timeOutFunc_local)->watchDogThread == 0) {
      deFree(timeOutFunc_local);
      timeOutFunc_local = (qpWatchDogFunc)0x0;
    }
  }
  return (qpWatchDog *)timeOutFunc_local;
}

Assistant:

qpWatchDog* qpWatchDog_create (qpWatchDogFunc timeOutFunc, void* userPtr, int totalTimeLimitSecs, int intervalTimeLimitSecs)
{
	/* Allocate & initialize. */
	qpWatchDog* dog = (qpWatchDog*)deCalloc(sizeof(qpWatchDog));
	if (!dog)
		return dog;

	DE_ASSERT(timeOutFunc);
	DE_ASSERT((totalTimeLimitSecs > 0) && (intervalTimeLimitSecs > 0));

	DBGPRINT(("qpWatchDog::create(%ds, %ds)\n", totalTimeLimitSecs, intervalTimeLimitSecs));

	dog->timeOutFunc		= timeOutFunc;
	dog->timeOutUserPtr		= userPtr;
	dog->totalTimeLimit		= totalTimeLimitSecs;
	dog->intervalTimeLimit	= intervalTimeLimitSecs;

	/* Reset (sets time values). */
	qpWatchDog_reset(dog);

	/* Initialize watchdog thread. */
	dog->status			= STATUS_THREAD_RUNNING;
	dog->watchDogThread = deThread_create(watchDogThreadFunc, dog, DE_NULL);
	if (!dog->watchDogThread)
	{
		deFree(dog);
		return DE_NULL;
	}

	return dog;
}